

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::Unlink(Instr *this)

{
  Instr *pIVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  pIVar1 = this->m_next;
  pIVar2 = this->m_prev;
  pIVar2->m_next = pIVar1;
  if (pIVar1 == (Instr *)0x0) {
    if (this->m_func->m_tailInstr != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x19b,"(this == this->m_func->m_tailInstr)",
                         "this == this->m_func->m_tailInstr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  else {
    pIVar1->m_prev = pIVar2;
  }
  if ((((this->globOptInstrString != (char16 *)0x0) &&
       (pIVar1 = this->m_next, pIVar1 != (Instr *)0x0)) &&
      (pIVar1->globOptInstrString == (char16 *)0x0)) &&
     ((pIVar1->m_kind != InstrKindLabel && (pIVar1->m_kind != InstrKindProfiledLabel)))) {
    pIVar1->globOptInstrString = this->globOptInstrString;
  }
  this->m_next = (Instr *)0x0;
  this->m_prev = (Instr *)0x0;
  return;
}

Assistant:

void
Instr::Unlink()
{
    m_prev->m_next = m_next;
    if (m_next)
    {
        m_next->m_prev = m_prev;
    }
    else
    {
        Assert(this == this->m_func->m_tailInstr);
    }

#if DBG_DUMP
    // Transferring the globOptInstrString to the next non-Label Instruction
    if(this->globOptInstrString != nullptr && m_next && m_next->globOptInstrString == nullptr && !m_next->IsLabelInstr())
    {
        m_next->globOptInstrString = this->globOptInstrString;
    }
#endif

#if DBG
    m_prev = nullptr;
    m_next = nullptr;
#endif
}